

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O2

FRandom * FRandom::StaticFindRNG(char *name)

{
  DWORD DVar1;
  size_t sVar2;
  FRandom **ppFVar3;
  FRandom *pFVar4;
  FRandom *local_18;
  
  sVar2 = strlen(name);
  DVar1 = CalcCRC32((BYTE *)name,(uint)sVar2);
  if (DVar1 == 0) {
    local_18 = &pr_exrandom;
  }
  else {
    ppFVar3 = &RNGList;
    while (pFVar4 = *ppFVar3, pFVar4 != (FRandom *)0x0) {
      if (DVar1 <= pFVar4->NameCRC) {
        if (pFVar4->NameCRC == DVar1) {
          return pFVar4;
        }
        break;
      }
      ppFVar3 = &pFVar4->Next;
    }
    pFVar4 = (FRandom *)operator_new(0x70);
    FRandom(pFVar4,name);
    local_18 = pFVar4;
    TArray<FRandom_*,_FRandom_*>::Push(&NewRNGs.super_TArray<FRandom_*,_FRandom_*>,&local_18);
  }
  return local_18;
}

Assistant:

FRandom *FRandom::StaticFindRNG (const char *name)
{
	DWORD NameCRC = CalcCRC32 ((const BYTE *)name, (unsigned int)strlen (name));

	// Use the default RNG if this one happens to have a CRC of 0.
	if (NameCRC == 0) return &pr_exrandom;

	// Find the RNG in the list, sorted by CRC
	FRandom **prev = &RNGList, *probe = RNGList;

	while (probe != NULL && probe->NameCRC < NameCRC)
	{
		prev = &probe->Next;
		probe = probe->Next;
	}
	// Found one so return it.
	if (probe == NULL || probe->NameCRC != NameCRC)
	{
		// A matching RNG doesn't exist yet so create it.
		probe = new FRandom(name);

		// Store the new RNG for destruction when ZDoom quits.
		NewRNGs.Push(probe);
	}
	return probe;
}